

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calendar_dates.c
# Opt level: O2

void read_calendar_date(calendar_date_t *record,int field_count,char **field_names,
                       char **field_values)

{
  int iVar1;
  exception_type_t eVar2;
  ulong uVar3;
  char *pcVar4;
  calendar_date_t *__dest;
  ulong uVar5;
  
  uVar3 = 0;
  record->service_id[0] = '\0';
  record->date[0] = '\0';
  uVar5 = (ulong)(uint)field_count;
  if (field_count < 1) {
    uVar5 = uVar3;
  }
  record->exception_type = ET_NOT_SET;
  do {
    if (uVar5 == uVar3) {
      return;
    }
    pcVar4 = field_names[uVar3];
    iVar1 = strcmp(pcVar4,"service_id");
    if (iVar1 == 0) {
      pcVar4 = field_values[uVar3];
      __dest = record;
LAB_00103c8a:
      strcpy(__dest->service_id,pcVar4);
    }
    else {
      iVar1 = strcmp(pcVar4,"date");
      if (iVar1 == 0) {
        pcVar4 = field_values[uVar3];
        __dest = (calendar_date_t *)record->date;
        goto LAB_00103c8a;
      }
      iVar1 = strcmp(pcVar4,"exception_type");
      if (iVar1 == 0) {
        eVar2 = parse_exception_type(field_values[uVar3]);
        record->exception_type = eVar2;
      }
    }
    uVar3 = uVar3 + 1;
  } while( true );
}

Assistant:

void read_calendar_date(calendar_date_t *record, int field_count, const char **field_names, const char **field_values) {
    init_calendar_date(record);

    for (int i = 0; i < field_count; i++) {
        if (strcmp(field_names[i], "service_id") == 0) {
            strcpy(record->service_id, field_values[i]);
            continue;
        }
        if (strcmp(field_names[i], "date") == 0) {
            strcpy(record->date, field_values[i]);
            continue;
        }
        if (strcmp(field_names[i], "exception_type") == 0) {
            record->exception_type = parse_exception_type(field_values[i]);
            continue;
        }
    }
}